

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix44<double> * __thiscall
Imath_2_5::Matrix44<double>::rotate<double>(Matrix44<double> *this,Vec3<double> *r)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Matrix44<double> P;
  Matrix44<double> local_98;
  
  dVar1 = cos(r->z);
  dVar2 = cos(r->y);
  dVar3 = cos(r->x);
  dVar4 = sin(r->z);
  dVar5 = sin(r->y);
  dVar6 = sin(r->x);
  dVar9 = dVar1 * dVar2;
  dVar10 = dVar2 * dVar4;
  dVar11 = dVar1 * dVar5 * dVar6 - dVar4 * dVar3;
  dVar12 = dVar1 * dVar3 + dVar4 * dVar5 * dVar6;
  dVar7 = dVar2 * dVar6;
  dVar8 = dVar4 * dVar6 + dVar3 * dVar1 * dVar5;
  dVar1 = dVar3 * dVar4 * dVar5 - dVar1 * dVar6;
  dVar2 = dVar2 * dVar3;
  Matrix44(&local_98,this);
  this->x[0][0] = (local_98.x[0][0] * dVar9 + dVar10 * local_98.x[1][0]) - local_98.x[2][0] * dVar5;
  this->x[0][1] = (local_98.x[0][1] * dVar9 + dVar10 * local_98.x[1][1]) - local_98.x[2][1] * dVar5;
  this->x[0][2] = (dVar9 * local_98.x[0][2] + dVar10 * local_98.x[1][2]) - dVar5 * local_98.x[2][2];
  this->x[0][3] = (dVar9 * local_98.x[0][3] + dVar10 * local_98.x[1][3]) - dVar5 * local_98.x[2][3];
  this->x[1][0] = local_98.x[2][0] * dVar7 + local_98.x[0][0] * dVar11 + dVar12 * local_98.x[1][0];
  this->x[1][1] = local_98.x[2][1] * dVar7 + local_98.x[0][1] * dVar11 + dVar12 * local_98.x[1][1];
  this->x[1][2] = dVar7 * local_98.x[2][2] + dVar11 * local_98.x[0][2] + dVar12 * local_98.x[1][2];
  this->x[1][3] = dVar7 * local_98.x[2][3] + dVar11 * local_98.x[0][3] + dVar12 * local_98.x[1][3];
  this->x[2][0] = local_98.x[2][0] * dVar2 + local_98.x[0][0] * dVar8 + local_98.x[1][0] * dVar1;
  this->x[2][1] = local_98.x[2][1] * dVar2 + local_98.x[0][1] * dVar8 + local_98.x[1][1] * dVar1;
  this->x[2][2] = dVar2 * local_98.x[2][2] + dVar8 * local_98.x[0][2] + dVar1 * local_98.x[1][2];
  this->x[2][3] = dVar2 * local_98.x[2][3] + dVar8 * local_98.x[0][3] + dVar1 * local_98.x[1][3];
  return this;
}

Assistant:

const Matrix44<T> &
Matrix44<T>::rotate (const Vec3<S> &r)
{
    S cos_rz, sin_rz, cos_ry, sin_ry, cos_rx, sin_rx;
    S m00, m01, m02;
    S m10, m11, m12;
    S m20, m21, m22;

    cos_rz = Math<S>::cos (r[2]);
    cos_ry = Math<S>::cos (r[1]);
    cos_rx = Math<S>::cos (r[0]);
    
    sin_rz = Math<S>::sin (r[2]);
    sin_ry = Math<S>::sin (r[1]);
    sin_rx = Math<S>::sin (r[0]);

    m00 =  cos_rz *  cos_ry;
    m01 =  sin_rz *  cos_ry;
    m02 = -sin_ry;
    m10 = -sin_rz *  cos_rx + cos_rz * sin_ry * sin_rx;
    m11 =  cos_rz *  cos_rx + sin_rz * sin_ry * sin_rx;
    m12 =  cos_ry *  sin_rx;
    m20 = -sin_rz * -sin_rx + cos_rz * sin_ry * cos_rx;
    m21 =  cos_rz * -sin_rx + sin_rz * sin_ry * cos_rx;
    m22 =  cos_ry *  cos_rx;

    Matrix44<T> P (*this);

    x[0][0] = P[0][0] * m00 + P[1][0] * m01 + P[2][0] * m02;
    x[0][1] = P[0][1] * m00 + P[1][1] * m01 + P[2][1] * m02;
    x[0][2] = P[0][2] * m00 + P[1][2] * m01 + P[2][2] * m02;
    x[0][3] = P[0][3] * m00 + P[1][3] * m01 + P[2][3] * m02;

    x[1][0] = P[0][0] * m10 + P[1][0] * m11 + P[2][0] * m12;
    x[1][1] = P[0][1] * m10 + P[1][1] * m11 + P[2][1] * m12;
    x[1][2] = P[0][2] * m10 + P[1][2] * m11 + P[2][2] * m12;
    x[1][3] = P[0][3] * m10 + P[1][3] * m11 + P[2][3] * m12;

    x[2][0] = P[0][0] * m20 + P[1][0] * m21 + P[2][0] * m22;
    x[2][1] = P[0][1] * m20 + P[1][1] * m21 + P[2][1] * m22;
    x[2][2] = P[0][2] * m20 + P[1][2] * m21 + P[2][2] * m22;
    x[2][3] = P[0][3] * m20 + P[1][3] * m21 + P[2][3] * m22;

    return *this;
}